

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

void * sc_switch(sc_context_t target,void *value)

{
  context_data *data;
  context_data *pcVar1;
  undefined1 auVar2 [16];
  
  data = sc_get_curr_context_data();
  if (data == (context_data *)0x0) {
    data = sc_get_main_context_data();
  }
  if (target != (sc_context_t)0x0) {
    if (data != target) {
      auVar2 = sc_jump_context(target->ctx,value);
      value = auVar2._8_8_;
      pcVar1 = sc_get_curr_context_data();
      if (pcVar1 == (context_data *)0x0) {
        pcVar1 = sc_get_main_context_data();
      }
      pcVar1->ctx = auVar2._0_8_;
      sc_set_curr_context_data(data);
      data->ctx = (sc_context_sp_t)0x0;
    }
    return value;
  }
  __assert_fail("target != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rhoot[P]sc/src/sc.c",0x6f,
                "void *sc_switch(sc_context_t, void *)");
}

Assistant:

void* SC_CALL_DECL sc_switch (sc_context_t target, void* value) {
    context_data* this_ctx = sc_current_context();
    sc_transfer_t transfer;

    assert(target != NULL);

    if (target != this_ctx) {
        transfer = sc_jump_context(target->ctx, value);
        sc_current_context()->ctx = transfer.ctx;
        sc_set_curr_context_data(this_ctx);
        this_ctx->ctx = NULL;
        value = transfer.data;
    }

    return value;
}